

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O1

void __thiscall bdNodeManager::doPeerCallback(bdNodeManager *this,bdId *id,uint32_t status)

{
  _List_node_base *p_Var1;
  
  for (p_Var1 = (this->mCallbacks).
                super__List_base<BitDhtCallback_*,_std::allocator<BitDhtCallback_*>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->mCallbacks; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 8))(p_Var1[1]._M_next,id,status);
  }
  return;
}

Assistant:

void bdNodeManager::doPeerCallback(const bdId *id, uint32_t status) {

#ifdef DEBUG_MGR
	std::cerr << "bdNodeManager::doPeerCallback()";
	mDhtFns->bdPrintId(std::cerr, id);
	std::cerr << "status: " << status;
	std::cerr << std::endl;
#endif

        /* search list */
        std::list<BitDhtCallback *>::iterator it;
        for (it = mCallbacks.begin(); it != mCallbacks.end(); it++) {
                (*it)->dhtPeerCallback(id, status);
        }
        return;
}